

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_s2point_vector_layer.cc
# Opt level: O2

void __thiscall
s2builderutil::S2PointVectorLayer::Build(S2PointVectorLayer *this,Graph *g,S2Error *error)

{
  pointer ppVar1;
  EdgeId edge_id;
  ulong uVar2;
  int set_id;
  vector<int,_std::allocator<int>_> labels;
  LabelFetcher fetcher;
  int32 local_7c;
  _Vector_base<int,_std::allocator<int>_> local_78;
  LabelFetcher local_58;
  
  S2Builder::Graph::LabelFetcher::LabelFetcher(&local_58,g,DIRECTED);
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar2 = 0;
      ppVar1 = (g->edges_->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(g->edges_->
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 3);
      uVar2 = uVar2 + 1) {
    if (ppVar1[uVar2].first == ppVar1[uVar2].second) {
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
                (this->points_,
                 (g->vertices_->
                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
                 super__Vector_impl_data._M_start + ppVar1[uVar2].first);
      if (this->label_set_ids_ != (LabelSetIds *)0x0) {
        S2Builder::Graph::LabelFetcher::Fetch
                  (&local_58,(EdgeId)uVar2,(vector<int,_std::allocator<int>_> *)&local_78);
        local_7c = IdSetLexicon::Add<std::vector<int,std::allocator<int>>>
                             (this->label_set_lexicon_,
                              (vector<int,_std::allocator<int>_> *)&local_78);
        std::vector<int,_std::allocator<int>_>::push_back(this->label_set_ids_,&local_7c);
      }
    }
    else {
      S2Error::Init(error,INVALID_ARGUMENT,"Found non-degenerate edges");
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_58.sibling_map_.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void S2PointVectorLayer::Build(const Graph& g, S2Error* error) {
  Graph::LabelFetcher fetcher(g, EdgeType::DIRECTED);

  vector<Label> labels;  // Temporary storage for labels.
  for (EdgeId edge_id = 0; edge_id < g.edges().size(); edge_id++) {
    auto& edge = g.edge(edge_id);
    if (edge.first != edge.second) {
      error->Init(S2Error::INVALID_ARGUMENT, "Found non-degenerate edges");
      continue;
    }
    points_->push_back(g.vertex(edge.first));
    if (label_set_ids_) {
      fetcher.Fetch(edge_id, &labels);
      int set_id = label_set_lexicon_->Add(labels);
      label_set_ids_->push_back(set_id);
    }
  }
}